

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  int iVar1;
  iterator iVar2;
  cmMakefile *pcVar3;
  cmSourceFile *in_RDX;
  char *extraout_RDX;
  char *pcVar4;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  SourceFileFlags SVar5;
  allocator local_41;
  cmSourceFile *local_40;
  string local_38;
  
  *(undefined4 *)&this->Target = 0;
  this->Makefile = (cmMakefile *)0x0;
  local_40 = in_RDX;
  ConstructSourceFileFlags((cmGeneratorTarget *)sf);
  iVar2 = std::
          _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
          ::find((_Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                  *)&sf[1].Location.Name,&local_40);
  if (iVar2._M_node == (_Base_ptr)&sf[1].Location.Name._M_string_length) {
    std::__cxx11::string::string((string *)&local_38,"MACOSX_PACKAGE_LOCATION",&local_41);
    pcVar3 = (cmMakefile *)cmSourceFile::GetProperty(local_40,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    pcVar4 = extraout_RDX_00;
    if (pcVar3 != (cmMakefile *)0x0) {
      this->Makefile = pcVar3;
      iVar1 = strcmp((char *)pcVar3,"Resources");
      pcVar4 = extraout_RDX_01;
      if (iVar1 == 0) {
        *(undefined4 *)&this->Target = 3;
      }
      else {
        *(undefined4 *)&this->Target = 4;
      }
    }
  }
  else {
    pcVar3 = (cmMakefile *)iVar2._M_node[1]._M_left;
    this->Target = (cmTarget *)iVar2._M_node[1]._M_parent;
    this->Makefile = pcVar3;
    pcVar4 = extraout_RDX;
  }
  SVar5.MacFolder = pcVar4;
  SVar5._0_8_ = this;
  return SVar5;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  std::map<cmSourceFile const*, SourceFileFlags>::iterator si =
    this->SourceFlagsMap.find(sf);
  if(si != this->SourceFlagsMap.end())
    {
    flags = si->second;
    }
  else
    {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if(const char* location = sf->GetProperty("MACOSX_PACKAGE_LOCATION"))
      {
      flags.MacFolder = location;
      if(strcmp(location, "Resources") == 0)
        {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        }
      else
        {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
        }
      }
    }
  return flags;
}